

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O1

void concept_const_suite::random_access_iterator_less_equal(void)

{
  bool bVar1;
  ulong uVar2;
  initializer_list<int> __l;
  circular_view<int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> data;
  basic_iterator<const_int> local_80;
  circular_view<int,_18446744073709551615UL> local_70;
  iterator_type local_50;
  vector<int,_std::allocator<int>_> local_40;
  
  local_70.member.data = (pointer)0x160000000b;
  local_70.member.cap = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_70;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,__l,(allocator_type *)&local_80);
  local_70.member.data =
       local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  if ((long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == 0) {
    local_70.member.data = (pointer)0x0;
  }
  local_70.member.cap =
       (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  local_80.current = 0;
  local_50.current = 0;
  local_80.parent = &local_70;
  local_70.member.size = local_70.member.cap;
  local_70.member.next = local_70.member.cap;
  local_50.parent = &local_70;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator<=
                    (&local_80,&local_50);
  boost::detail::test_impl
            ("span.begin() <= span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x21e,"void concept_const_suite::random_access_iterator_less_equal()",bVar1);
  local_50.current = local_70.member.cap * 2;
  uVar2 = local_50.current - (local_70.member.cap & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar2 >> 0x38 < 2) {
    local_80.current = local_50.current - 1 & local_70.member.next - local_70.member.size;
  }
  else {
    local_80.current = (local_70.member.next - local_70.member.size) % local_50.current;
  }
  if ((byte)(uVar2 >> 0x38) < 2) {
    local_50.current = local_50.current - 1 & local_70.member.next;
  }
  else {
    local_50.current = local_70.member.next % local_50.current;
  }
  local_80.parent = &local_70;
  local_50.parent = &local_70;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator<=
                    (&local_80,&local_50);
  boost::detail::test_impl
            ("span.begin() <= span.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x21f,"void concept_const_suite::random_access_iterator_less_equal()",bVar1);
  local_50.current = local_70.member.cap * 2;
  uVar2 = local_50.current - (local_70.member.cap & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar2 >> 0x38 < 2) {
    local_80.current = local_50.current - 1 & local_70.member.next;
  }
  else {
    local_80.current = local_70.member.next % local_50.current;
  }
  if ((byte)(uVar2 >> 0x38) < 2) {
    local_50.current = local_70.member.next - local_70.member.size & local_50.current - 1;
  }
  else {
    local_50.current = (local_70.member.next - local_70.member.size) % local_50.current;
  }
  local_80.parent = &local_70;
  local_50.parent = &local_70;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator<=
                    (&local_80,&local_50);
  boost::detail::test_impl
            ("!(span.end() <= span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x220,"void concept_const_suite::random_access_iterator_less_equal()",!bVar1);
  local_50.current = local_70.member.cap * 2;
  uVar2 = local_50.current - (local_70.member.cap & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar2 >> 0x38 < 2) {
    local_80.current = local_50.current - 1 & local_70.member.next;
  }
  else {
    local_80.current = local_70.member.next % local_50.current;
  }
  if ((byte)(uVar2 >> 0x38) < 2) {
    local_50.current = local_50.current - 1 & local_70.member.next;
  }
  else {
    local_50.current = local_70.member.next % local_50.current;
  }
  local_80.parent = &local_70;
  local_50.parent = &local_70;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator<=
                    (&local_80,&local_50);
  boost::detail::test_impl
            ("span.end() <= span.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x221,"void concept_const_suite::random_access_iterator_less_equal()",bVar1);
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void random_access_iterator_less_equal()
{
    // a <= b
    std::vector<int> data = { 11, 22, 33, 44 };
    const circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    BOOST_TEST(span.begin() <= span.begin());
    BOOST_TEST(span.begin() <= span.end());
    BOOST_TEST(!(span.end() <= span.begin()));
    BOOST_TEST(span.end() <= span.end());
}